

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodev_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  if (book->used_entries < 1) {
    return 0;
  }
  iVar5 = 0;
  while( true ) {
    if (n <= iVar5) {
      return 0;
    }
    lVar2 = decode_packed_entry_number(book,b);
    if ((int)lVar2 == -1) break;
    lVar3 = book->dim;
    lVar2 = (int)lVar2 * lVar3;
    pfVar1 = book->valuelist;
    lVar4 = (long)iVar5;
    if (lVar3 < 1) {
      lVar3 = 0;
    }
    for (lVar6 = 0; (lVar4 + lVar6 < (long)n && (lVar3 != lVar6)); lVar6 = lVar6 + 1) {
      a[lVar4 + lVar6] = pfVar1[lVar2 + lVar6] + a[lVar4 + lVar6];
    }
    iVar5 = iVar5 + (int)lVar6;
  }
  return -1;
}

Assistant:

long vorbis_book_decodev_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int i,j,entry;
    float *t;

    for(i=0;i<n;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      t     = book->valuelist+entry*book->dim;
      for(j=0;i<n && j<book->dim;)
        a[i++]+=t[j++];
    }
  }
  return(0);
}